

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerScaledAngles
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  Vertex e;
  Corner e_00;
  Corner e_01;
  Vertex e_02;
  Corner e_03;
  Corner e_04;
  bool bVar2;
  double *pdVar3;
  ParentMeshT *in_RDI;
  double s_1;
  double s;
  Corner c;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  CornerSet *__range2;
  MeshData<geometrycentral::surface::Corner,_double> *in_stack_fffffffffffffea8;
  SurfaceMesh *in_stack_fffffffffffffeb0;
  MeshData<geometrycentral::surface::Corner,_double> *in_stack_fffffffffffffec0;
  ParentMeshT *in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  MeshData<geometrycentral::surface::Corner,_double> *in_stack_fffffffffffffee0;
  Vertex local_60;
  Vertex *this_00;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffeb0);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffeb0);
  MeshData<geometrycentral::surface::Corner,_double>::MeshData(in_stack_fffffffffffffee0,in_RDI);
  MeshData<geometrycentral::surface::Corner,_double>::operator=
            ((MeshData<geometrycentral::surface::Corner,_double> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)in_stack_fffffffffffffeb0);
  SurfaceMesh::corners(in_stack_fffffffffffffeb0);
  this_00 = &local_60;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffeb0);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffeb0);
  while( true ) {
    bVar2 = RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                       in_stack_fffffffffffffeb0,
                       (RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                       in_stack_fffffffffffffea8);
    if (!bVar2) break;
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator*
              ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)0x2433d0);
    Corner::vertex((Corner *)in_stack_fffffffffffffeb0);
    bVar2 = Vertex::isBoundary(this_00);
    if (bVar2) {
      in_stack_fffffffffffffec0 =
           (MeshData<geometrycentral::surface::Corner,_double> *)
           &in_RDI[1].heFaceArr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      Corner::vertex((Corner *)in_stack_fffffffffffffeb0);
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)in_stack_fffffffffffffed0;
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Vertex,_double> *)
                          in_stack_fffffffffffffec0,e);
      in_stack_fffffffffffffec8 = (ParentMeshT *)(3.141592653589793 / *pdVar3);
      e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffed0;
      e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         (in_stack_fffffffffffffec0,e_00);
      in_stack_fffffffffffffed0 = (double)in_stack_fffffffffffffec8 * *pdVar3;
      e_01.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffed0;
      e_01.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         (in_stack_fffffffffffffec0,e_01);
      *pdVar3 = in_stack_fffffffffffffed0;
    }
    else {
      in_stack_fffffffffffffea8 =
           (MeshData<geometrycentral::surface::Corner,_double> *)
           &in_RDI[1].heFaceArr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      Corner::vertex((Corner *)in_stack_fffffffffffffeb0);
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffed0;
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Vertex,_double> *)
                          in_stack_fffffffffffffec0,e_02);
      in_stack_fffffffffffffeb0 = (SurfaceMesh *)(6.283185307179586 / *pdVar3);
      e_03.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffed0;
      e_03.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         (in_stack_fffffffffffffec0,e_03);
      dVar1 = (double)in_stack_fffffffffffffeb0 * *pdVar3;
      e_04.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffed0;
      e_04.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffec8;
      pdVar3 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         (in_stack_fffffffffffffec0,e_04);
      *pdVar3 = dVar1;
    }
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
               in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeCornerScaledAngles() {
  cornerAnglesQ.ensureHave();
  vertexAngleSumsQ.ensureHave();

  cornerScaledAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    if (c.vertex().isBoundary()) {
      double s = PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    } else {
      double s = 2.0 * PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    }
  }
}